

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall V1Transport::SetMessageToSend(V1Transport *this,CSerializedNetMsg *msg)

{
  pointer puVar1;
  bool bVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock38;
  CMessageHeader hdr;
  uint256 hash;
  VectorWriter local_70;
  unique_lock<std::mutex> local_60;
  CMessageHeader local_50;
  uint8_t local_38 [8] [4];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_60,&this->m_send_mutex,"m_send_mutex"
             ,"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x331,false);
  if ((this->m_sending_header == false) &&
     ((ulong)((long)(this->m_message_to_send).data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_message_to_send).data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= this->m_bytes_sent)) {
    Hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>((uint256 *)local_38,&msg->data);
    CMessageHeader::CMessageHeader
              (&local_50,&this->m_magic_bytes,(msg->m_type)._M_dataplus._M_p,
               *(int *)&(msg->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
               *(int *)&(msg->data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
    local_50.pchChecksum[0] = local_38[0][0];
    local_50.pchChecksum[1] = local_38[0][1];
    local_50.pchChecksum[2] = local_38[0][2];
    local_50.pchChecksum[3] = local_38[0][3];
    puVar1 = (this->m_header_to_send).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_header_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar1) {
      (this->m_header_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
    VectorWriter::VectorWriter<CMessageHeader&>(&local_70,&this->m_header_to_send,0,&local_50);
    CSerializedNetMsg::operator=(&this->m_message_to_send,msg);
    this->m_sending_header = true;
    this->m_bytes_sent = 0;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool V1Transport::SetMessageToSend(CSerializedNetMsg& msg) noexcept
{
    AssertLockNotHeld(m_send_mutex);
    // Determine whether a new message can be set.
    LOCK(m_send_mutex);
    if (m_sending_header || m_bytes_sent < m_message_to_send.data.size()) return false;

    // create dbl-sha256 checksum
    uint256 hash = Hash(msg.data);

    // create header
    CMessageHeader hdr(m_magic_bytes, msg.m_type.c_str(), msg.data.size());
    memcpy(hdr.pchChecksum, hash.begin(), CMessageHeader::CHECKSUM_SIZE);

    // serialize header
    m_header_to_send.clear();
    VectorWriter{m_header_to_send, 0, hdr};

    // update state
    m_message_to_send = std::move(msg);
    m_sending_header = true;
    m_bytes_sent = 0;
    return true;
}